

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::
MessageDifferencerTest_PartialEqualityTestForceCompareWorksForRepeatedField_Test::TestBody
          (MessageDifferencerTest_PartialEqualityTestForceCompareWorksForRepeatedField_Test *this)

{
  bool bVar1;
  char *in_R9;
  pointer *__ptr;
  TestNoPresenceField msg1;
  TestNoPresenceField msg2;
  MessageDifferencer default_differencer;
  MessageDifferencer force_compare_differencer;
  AssertHelper local_440;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_438;
  internal local_430 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_428;
  string local_420;
  undefined1 local_400 [72];
  TestNoPresenceField local_3b8;
  MessageDifferencer local_370;
  MessageDifferencer local_1c0;
  
  util::MessageDifferencer::MessageDifferencer(&local_1c0);
  util::MessageDifferencer::set_scope(&local_1c0,PARTIAL);
  util::MessageDifferencer::set_force_compare_no_presence(&local_1c0,true);
  util::MessageDifferencer::MessageDifferencer(&local_370);
  util::MessageDifferencer::set_scope(&local_370,PARTIAL);
  util::MessageDifferencer::set_force_compare_no_presence(&local_370,false);
  MakeTestNoPresenceField();
  MakeTestNoPresenceField();
  protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<proto3_unittest::TestNoPresenceField>>
            ((RepeatedPtrFieldBase *)(local_400 + 0x18));
  local_430[0] = (internal)
                 util::MessageDifferencer::Compare
                           (&local_1c0,(Message *)local_400,&local_3b8.super_Message);
  local_428 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_430[0]) {
    testing::Message::Message((Message *)&local_438);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_420,local_430,
               (AssertionResult *)"force_compare_differencer.Compare(msg1, msg2)","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_440,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x123,local_420._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_440,(Message *)&local_438);
    testing::internal::AssertHelper::~AssertHelper(&local_440);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._M_dataplus._M_p != &local_420.field_2) {
      operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
    }
    if (local_438._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_438._M_head_impl + 8))();
    }
    if (local_428 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_428,local_428);
    }
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::AssertNotDebugCapacity
            (&local_1c0.force_compare_failure_triggering_fields_.
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
  local_430[0] = (internal)
                 (local_1c0.force_compare_failure_triggering_fields_.
                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .settings_.
                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                  value.size_ < 2);
  local_428 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_430[0]) {
    testing::Message::Message((Message *)&local_438);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_420,local_430,(AssertionResult *)0x1222654,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_440,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x125,local_420._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_440,(Message *)&local_438);
    testing::internal::AssertHelper::~AssertHelper(&local_440);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._M_dataplus._M_p != &local_420.field_2) {
      operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
    }
    if (local_438._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_438._M_head_impl + 8))();
    }
    if (local_428 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_428,local_428);
    }
  }
  local_430[0] = (internal)
                 util::MessageDifferencer::Compare
                           (&local_370,(Message *)local_400,&local_3b8.super_Message);
  local_428 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_430[0]) {
    testing::Message::Message((Message *)&local_438);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_420,local_430,(AssertionResult *)"default_differencer.Compare(msg1, msg2)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_440,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x126,local_420._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_440,(Message *)&local_438);
    testing::internal::AssertHelper::~AssertHelper(&local_440);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._M_dataplus._M_p != &local_420.field_2) {
      operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
    }
    if (local_438._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_438._M_head_impl + 8))();
    }
    if (local_428 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_428,local_428);
    }
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::AssertNotDebugCapacity
            (&local_370.force_compare_failure_triggering_fields_.
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
  local_430[0] = (internal)
                 (local_370.force_compare_failure_triggering_fields_.
                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .settings_.
                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                  value.size_ < 2);
  local_428 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_430[0]) {
    testing::Message::Message((Message *)&local_438);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_420,local_430,
               (AssertionResult *)"default_differencer.NoPresenceFieldsCausingFailure().empty()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_440,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x127,local_420._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_440,(Message *)&local_438);
    testing::internal::AssertHelper::~AssertHelper(&local_440);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._M_dataplus._M_p != &local_420.field_2) {
      operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
    }
    if (local_438._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_438._M_head_impl + 8))();
    }
    if (local_428 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_428,local_428);
    }
  }
  bVar1 = util::MessageDifferencer::Compare
                    (&local_1c0,&local_3b8.super_Message,(Message *)local_400);
  local_430[0] = (internal)!bVar1;
  local_428 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_438);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_420,local_430,
               (AssertionResult *)"force_compare_differencer.Compare(msg2, msg1)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_440,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x129,local_420._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_440,(Message *)&local_438);
    testing::internal::AssertHelper::~AssertHelper(&local_440);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._M_dataplus._M_p != &local_420.field_2) {
      operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
    }
    if (local_438._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_438._M_head_impl + 8))();
    }
    if (local_428 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_428,local_428);
    }
  }
  bVar1 = util::MessageDifferencer::Compare
                    (&local_370,&local_3b8.super_Message,(Message *)local_400);
  local_430[0] = (internal)!bVar1;
  local_428 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_438);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_420,local_430,(AssertionResult *)"default_differencer.Compare(msg2, msg1)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_440,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x12a,local_420._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_440,(Message *)&local_438);
    testing::internal::AssertHelper::~AssertHelper(&local_440);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._M_dataplus._M_p != &local_420.field_2) {
      operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
    }
    if (local_438._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_438._M_head_impl + 8))();
    }
    if (local_428 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_428,local_428);
    }
  }
  proto3_unittest::TestNoPresenceField::~TestNoPresenceField(&local_3b8);
  proto3_unittest::TestNoPresenceField::~TestNoPresenceField((TestNoPresenceField *)local_400);
  util::MessageDifferencer::~MessageDifferencer(&local_370);
  util::MessageDifferencer::~MessageDifferencer(&local_1c0);
  return;
}

Assistant:

TEST(MessageDifferencerTest,
     PartialEqualityTestForceCompareWorksForRepeatedField) {
  util::MessageDifferencer force_compare_differencer;
  force_compare_differencer.set_scope(util::MessageDifferencer::PARTIAL);
  force_compare_differencer.set_force_compare_no_presence(true);

  // This differencer is not setting force_compare_no_presence.
  util::MessageDifferencer default_differencer;
  default_differencer.set_scope(util::MessageDifferencer::PARTIAL);
  default_differencer.set_force_compare_no_presence(false);

  // Repeated fields always have presence, so clearing them would remove them
  // from the comparison.
  // Create the testing protos
  proto3_unittest::TestNoPresenceField msg1 = MakeTestNoPresenceField();
  proto3_unittest::TestNoPresenceField msg2 = MakeTestNoPresenceField();

  msg1.clear_no_presence_repeated_nested();
  EXPECT_TRUE(force_compare_differencer.Compare(msg1, msg2));
  EXPECT_TRUE(
      force_compare_differencer.NoPresenceFieldsCausingFailure().empty());
  EXPECT_TRUE(default_differencer.Compare(msg1, msg2));
  EXPECT_TRUE(default_differencer.NoPresenceFieldsCausingFailure().empty());

  EXPECT_FALSE(force_compare_differencer.Compare(msg2, msg1));
  EXPECT_FALSE(default_differencer.Compare(msg2, msg1));
}